

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.c
# Opt level: O3

void hd_vwarn(hd_context *ctx,char *fmt,__va_list_tag *ap)

{
  int *piVar1;
  hd_warn_context *__s2;
  int iVar2;
  char buf [256];
  char acStack_118 [255];
  undefined1 local_19;
  
  snprintf(acStack_118,0x100,fmt,ap);
  local_19 = 0;
  __s2 = ctx->warn;
  iVar2 = strcmp(acStack_118,__s2->message);
  if (iVar2 == 0) {
    piVar1 = &__s2->count;
    *piVar1 = *piVar1 + 1;
  }
  else {
    hd_vwarn_cold_1();
  }
  return;
}

Assistant:

void hd_vwarn(hd_context *ctx, const char *fmt, va_list ap)
{
    char buf[sizeof ctx->warn->message];

    snprintf(buf, sizeof buf, fmt, ap);
    buf[sizeof(buf) - 1] = 0;
#ifdef USE_OUTPUT_DEBUG_STRING
    OutputDebugStringA(buf);
	OutputDebugStringA("\n");
#endif

    if (!strcmp(buf, ctx->warn->message))
    {
        ctx->warn->count++;
    }
    else
    {
        hd_flush_warnings(ctx);
        fprintf(stderr, "warning: %s\n", buf);
        hd_strlcpy(ctx->warn->message, buf, sizeof ctx->warn->message);
        ctx->warn->count = 1;
    }
}